

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colors.cpp
# Opt level: O0

bool __thiscall
Colors::outputColorCode::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  int iVar1;
  char *pcVar2;
  bool local_13;
  bool local_12;
  anon_class_1_0_00000001 *this_local;
  
  pcVar2 = getenv("COLORS");
  if ((pcVar2 != (char *)0x0) && (pcVar2 = getenv("COLORS"), *pcVar2 == '1')) {
    return true;
  }
  iVar1 = isatty(1);
  local_12 = false;
  if (iVar1 != 0) {
    pcVar2 = getenv("COLORS");
    local_13 = true;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = getenv("COLORS");
      local_13 = *pcVar2 != '0';
    }
    local_12 = local_13;
  }
  return local_12;
}

Assistant:

void Colors::outputColorCode(std::ostream& stream, const char* colorCode) {
  const static bool has_color = []() {
    return (getenv("COLORS") && getenv("COLORS")[0] == '1') || // forced
           (isatty(STDOUT_FILENO) &&
            (!getenv("COLORS") || getenv("COLORS")[0] != '0')); // implicit
  }();
  if (has_color && colors_enabled) {
    stream << colorCode;
  }
}